

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void ptrmapPut(BtShared *pBt,Pgno key,u8 eType,Pgno parent,int *pRC)

{
  u8 *puVar1;
  uint uVar2;
  PgHdr *pPg;
  Pgno PVar3;
  int iVar4;
  u32 uVar5;
  PgHdr *in_RAX;
  DbPage *pDbPage;
  PgHdr *local_38;
  
  if (*pRC != 0) {
    return;
  }
  if (key == 0) {
    iVar4 = sqlite3CorruptError(0x10ddd);
LAB_00163521:
    *pRC = iVar4;
    return;
  }
  local_38 = in_RAX;
  PVar3 = ptrmapPageno(pBt,key);
  iVar4 = (*pBt->pPager->xGet)(pBt->pPager,PVar3,&local_38,0);
  pPg = local_38;
  if (iVar4 != 0) goto LAB_00163521;
  if (*local_38->pExtra == '\0') {
    uVar2 = (~PVar3 + key) * 5;
    if (-1 < (int)uVar2) {
      puVar1 = (u8 *)((long)local_38->pData + (ulong)uVar2);
      if ((*(u8 *)((long)local_38->pData + (ulong)uVar2) != eType) ||
         (uVar5 = sqlite3Get4byte(puVar1 + 1), uVar5 != parent)) {
        iVar4 = sqlite3PagerWrite(pPg);
        *pRC = iVar4;
        if (iVar4 == 0) {
          *puVar1 = eType;
          puVar1[1] = (u8)(parent >> 0x18);
          puVar1[2] = (u8)(parent >> 0x10);
          puVar1[3] = (u8)(parent >> 8);
          puVar1[4] = (u8)parent;
        }
      }
      goto LAB_0016350c;
    }
    iVar4 = 0x10def;
  }
  else {
    iVar4 = 0x10dea;
  }
  iVar4 = sqlite3CorruptError(iVar4);
  *pRC = iVar4;
LAB_0016350c:
  sqlite3PagerUnref(local_38);
  return;
}

Assistant:

static void ptrmapPut(BtShared *pBt, Pgno key, u8 eType, Pgno parent, int *pRC){
  DbPage *pDbPage;  /* The pointer map page */
  u8 *pPtrmap;      /* The pointer map data */
  Pgno iPtrmap;     /* The pointer map page number */
  int offset;       /* Offset in pointer map page */
  int rc;           /* Return code from subfunctions */

  if( *pRC ) return;

  assert( sqlite3_mutex_held(pBt->mutex) );
  /* The super-journal page number must never be used as a pointer map page */
  assert( 0==PTRMAP_ISPAGE(pBt, PENDING_BYTE_PAGE(pBt)) );

  assert( pBt->autoVacuum );
  if( key==0 ){
    *pRC = SQLITE_CORRUPT_BKPT;
    return;
  }
  iPtrmap = PTRMAP_PAGENO(pBt, key);
  rc = sqlite3PagerGet(pBt->pPager, iPtrmap, &pDbPage, 0);
  if( rc!=SQLITE_OK ){
    *pRC = rc;
    return;
  }
  if( ((char*)sqlite3PagerGetExtra(pDbPage))[0]!=0 ){
    /* The first byte of the extra data is the MemPage.isInit byte.
    ** If that byte is set, it means this page is also being used
    ** as a btree page. */
    *pRC = SQLITE_CORRUPT_BKPT;
    goto ptrmap_exit;
  }
  offset = PTRMAP_PTROFFSET(iPtrmap, key);
  if( offset<0 ){
    *pRC = SQLITE_CORRUPT_BKPT;
    goto ptrmap_exit;
  }
  assert( offset <= (int)pBt->usableSize-5 );
  pPtrmap = (u8 *)sqlite3PagerGetData(pDbPage);

  if( eType!=pPtrmap[offset] || get4byte(&pPtrmap[offset+1])!=parent ){
    TRACE(("PTRMAP_UPDATE: %d->(%d,%d)\n", key, eType, parent));
    *pRC= rc = sqlite3PagerWrite(pDbPage);
    if( rc==SQLITE_OK ){
      pPtrmap[offset] = eType;
      put4byte(&pPtrmap[offset+1], parent);
    }
  }

ptrmap_exit:
  sqlite3PagerUnref(pDbPage);
}